

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ulocdata.cpp
# Opt level: O0

ULocaleData * ulocdata_open_63(char *localeID,UErrorCode *status)

{
  UBool UVar1;
  UResourceBundle *pUVar2;
  ULocaleData *uld;
  UErrorCode *status_local;
  char *localeID_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    localeID_local = (char *)uprv_malloc_63(0x18);
    if (localeID_local == (char *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      localeID_local = (char *)0x0;
    }
    else {
      localeID_local[0x10] = '\0';
      localeID_local[0x11] = '\0';
      localeID_local[0x12] = '\0';
      localeID_local[0x13] = '\0';
      localeID_local[0x14] = '\0';
      localeID_local[0x15] = '\0';
      localeID_local[0x16] = '\0';
      localeID_local[0x17] = '\0';
      *localeID_local = '\0';
      pUVar2 = ures_open_63((char *)0x0,localeID,status);
      *(UResourceBundle **)(localeID_local + 8) = pUVar2;
      pUVar2 = ures_open_63("icudt63l-lang",localeID,status);
      *(UResourceBundle **)(localeID_local + 0x10) = pUVar2;
      UVar1 = U_FAILURE(*status);
      if (UVar1 != '\0') {
        uprv_free_63(localeID_local);
        localeID_local = (char *)0x0;
      }
    }
  }
  else {
    localeID_local = (char *)0x0;
  }
  return (ULocaleData *)localeID_local;
}

Assistant:

U_CAPI ULocaleData* U_EXPORT2
ulocdata_open(const char *localeID, UErrorCode *status)
{
   ULocaleData *uld;

   if (U_FAILURE(*status)) {
       return NULL;
   }

   uld = (ULocaleData *)uprv_malloc(sizeof(ULocaleData));
   if (uld == NULL) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return(NULL);
   }

   uld->langBundle = NULL;

   uld->noSubstitute = FALSE;
   uld->bundle = ures_open(NULL, localeID, status);
   uld->langBundle = ures_open(U_ICUDATA_LANG, localeID, status);

   if (U_FAILURE(*status)) {
      uprv_free(uld);
      return NULL;
   }

   return uld;
}